

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlsxio_write.c
# Opt level: O1

void xlsxiowrite_next_row(xlsxiowriter handle)

{
  size_t sVar1;
  
  if (handle != (xlsxiowriter)0x0) {
    if (((handle->sheetopen == 0) && (handle->rowstobuffer != 0)) &&
       (sVar1 = handle->rowstobuffer - 1, handle->rowstobuffer = sVar1, sVar1 == 0)) {
      flush_buffer(handle);
    }
    if (handle->rowopen == 0) {
      write_row_start(handle,(char *)0x0);
    }
    if (handle->rowstobuffer == 0) {
      fwrite("</row>",6,1,(FILE *)handle->pipe_write);
    }
    else {
      append_data(&handle->buf,&handle->buflen,"</row>");
    }
    handle->rowopen = 0;
    handle->pcurrentcolumn = &handle->columninfo;
  }
  return;
}

Assistant:

DLL_EXPORT_XLSXIO void xlsxiowrite_next_row (xlsxiowriter handle)
{
  if (!handle)
    return;
  //check if buffer should be flushed
  if (!handle->sheetopen) {
    if (handle->rowstobuffer > 0) {
      if (--handle->rowstobuffer == 0) {
        flush_buffer(handle);
      } else {
      }
    }
  }
  //start new row if needed
  if (!handle->rowopen)
    write_row_start(handle, NULL);
  //end row
  if (handle->rowstobuffer == 0)
    fprintf(handle->pipe_write, "</row>" OPTIONAL_LINE_BREAK);
  else
    append_data(&handle->buf, &handle->buflen, "</row>" OPTIONAL_LINE_BREAK);
  handle->rowopen = 0;
  handle->pcurrentcolumn = &handle->columninfo;
}